

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_sgemm_int8.h
# Opt level: O0

void ncnn::conv_im2col_sgemm_int8_requant_sse
               (Mat *bottom_blob,Mat *top_blob,Mat *_kernel,int kernel_w,int kernel_h,int stride_w,
               int stride_h,Mat *_bias,vector<float,_std::allocator<float>_> *scale_requant,
               Option *opt)

{
  char cVar1;
  char *pcVar2;
  reference pvVar3;
  int in_ECX;
  Mat *in_RDX;
  long in_RSI;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  int in_stack_00000008;
  Mat *in_stack_00000010;
  vector<float,_std::allocator<float>_> *in_stack_00000018;
  int k_3;
  char *va_3;
  char *vb_3;
  int sum_1;
  int n_5;
  int n_4;
  int n_3;
  int k_2;
  int sum [4];
  char *va_2;
  char *vb_2;
  int j_2;
  float scale_requant_out0_1;
  float scale_requant_in0_1;
  float bias0_1;
  char *output;
  int i_4;
  int k_1;
  char *va_1;
  char *vb_1;
  int sum3_1;
  int sum2_1;
  int sum1_1;
  int sum0_1;
  int n_2;
  int n_1;
  int n;
  int k;
  int sum3 [4];
  int sum2 [4];
  int sum1 [4];
  int sum0 [4];
  char *va;
  char *vb;
  int j_1;
  float scale_requant_out3;
  float scale_requant_in3;
  float scale_requant_out2;
  float scale_requant_in2;
  float scale_requant_out1;
  float scale_requant_in1;
  float scale_requant_out0;
  float scale_requant_in0;
  float bias3;
  float bias2;
  float bias1;
  float bias0;
  char *output3;
  char *output2;
  char *output1;
  char *output0;
  int i_3;
  int pp_1;
  int remain_outch_start_1;
  int nn_outch_1;
  int q_3;
  char *ktmp_1;
  char *k0_1;
  int p_2;
  int q_2;
  char *ktmp;
  char *k3;
  char *k2;
  char *k1;
  char *k0;
  int p_1;
  int pp;
  int remain_outch_start;
  int nn_outch;
  Mat kernel_tm;
  int q_1;
  char *tmpptr_1;
  char *img0_1;
  int i_2;
  int q;
  char *tmpptr;
  char *img3;
  char *img2;
  char *img1;
  char *img0;
  int i_1;
  int ii;
  int remain_size_start;
  int nn_size;
  Mat bottom_tm;
  int K;
  int N;
  int out_size;
  int kernel_size;
  int index;
  int col;
  int row;
  int v;
  int u;
  char *input;
  int p;
  int j;
  int i;
  int retID;
  char *ret;
  Mat bottom_im2row;
  float *bias;
  char *kernel;
  int outch;
  int outh;
  int outw;
  int inch;
  int w;
  undefined7 in_stack_fffffffffffff708;
  undefined1 in_stack_fffffffffffff70f;
  char *in_stack_fffffffffffff710;
  int _c;
  Mat *in_stack_fffffffffffff718;
  Mat *in_stack_fffffffffffff720;
  float local_8b4;
  float local_868;
  float local_864;
  float local_860;
  float local_85c;
  int local_7e4;
  Mat local_7e0;
  char *local_7a0;
  Mat local_798;
  char *local_758;
  int local_74c;
  int local_748;
  int local_744;
  int local_740;
  int local_73c;
  int local_738 [4];
  Mat local_728;
  char *local_6e8;
  Mat local_6e0;
  char *local_6a0;
  int local_698;
  value_type local_694;
  value_type local_690;
  float local_68c;
  Mat local_688;
  char *local_648;
  int local_640;
  int local_63c;
  Mat local_638;
  char *local_5f8;
  Mat local_5f0;
  char *local_5b0;
  int local_5a8;
  int local_5a4;
  int local_5a0;
  int local_59c;
  int local_598;
  int local_594;
  int local_590;
  int local_58c;
  int local_588 [4];
  int local_578 [4];
  int local_568 [4];
  int local_558 [6];
  Mat local_540;
  char *local_500;
  Mat local_4f8;
  char *local_4b8;
  int local_4ac;
  value_type local_4a8;
  value_type local_4a4;
  value_type local_4a0;
  value_type local_49c;
  value_type local_498;
  value_type local_494;
  value_type local_490;
  value_type local_48c;
  float local_488;
  float local_484;
  float local_480;
  float local_47c;
  Mat local_478;
  char *local_438;
  Mat local_430;
  char *local_3f0;
  Mat local_3e8;
  char *local_3a8;
  Mat local_3a0;
  char *local_360;
  int local_354;
  int local_350;
  int local_34c;
  int local_348;
  int local_344;
  Mat local_340;
  char *local_300;
  char *local_2f8;
  int local_2f0;
  int local_2ec;
  Mat local_2e8;
  char *local_2a8;
  char *local_2a0;
  char *local_298;
  char *local_290;
  char *local_288;
  int local_280;
  int local_27c;
  int local_278;
  int local_274;
  int local_22c;
  Mat local_228;
  char *local_1e8;
  char *local_1e0;
  int local_1d8;
  int local_1d4;
  Mat local_1d0;
  char *local_190;
  char *local_188;
  char *local_180;
  char *local_178;
  char *local_170;
  int local_168;
  int local_164;
  int local_160;
  int local_15c;
  int local_118;
  int local_114;
  int local_110;
  int local_10c;
  int local_108;
  int local_104;
  int local_100;
  int local_fc;
  int local_f8;
  Mat local_e8;
  char *local_a8;
  int local_a0;
  int local_9c;
  int local_98;
  int local_94;
  char *local_90;
  Mat local_88;
  float *local_48;
  char *local_40;
  int local_38;
  int local_34;
  int local_30;
  int local_2c;
  int local_28;
  int local_24;
  int local_20;
  int local_1c;
  
  local_28 = *(int *)(in_RDI + 0x2c);
  local_2c = *(int *)(in_RDI + 0x34);
  local_30 = *(int *)(in_RSI + 0x2c);
  local_34 = *(int *)(in_RSI + 0x30);
  local_38 = *(int *)(in_RSI + 0x34);
  local_24 = in_R9D;
  local_20 = in_R8D;
  local_1c = in_ECX;
  local_40 = Mat::operator_cast_to_signed_char_(in_RDX);
  local_48 = Mat::operator_cast_to_float_(in_stack_00000010);
  Mat::Mat(in_stack_fffffffffffff720,(int)((ulong)in_stack_fffffffffffff718 >> 0x20),
           (int)in_stack_fffffffffffff718,(size_t)in_stack_fffffffffffff710,
           (Allocator *)CONCAT17(in_stack_fffffffffffff70f,in_stack_fffffffffffff708));
  local_90 = Mat::operator_cast_to_signed_char_(&local_88);
  local_94 = 0;
  for (local_98 = 0; local_98 < local_34; local_98 = local_98 + 1) {
    for (local_9c = 0; local_9c < local_30; local_9c = local_9c + 1) {
      for (local_a0 = 0; local_a0 < local_2c; local_a0 = local_a0 + 1) {
        Mat::channel(in_stack_fffffffffffff718,(int)((ulong)in_stack_fffffffffffff710 >> 0x20));
        pcVar2 = Mat::operator_cast_to_signed_char_(&local_e8);
        Mat::~Mat((Mat *)0x13dec2);
        for (local_f8 = 0; local_f8 < local_20; local_f8 = local_f8 + 1) {
          for (local_fc = 0; local_fc < local_1c; local_fc = local_fc + 1) {
            local_100 = local_f8 + local_98 * in_stack_00000008;
            local_104 = local_fc + local_9c * local_24;
            local_108 = local_100 * local_28 + local_104;
            local_90[local_94] = pcVar2[local_108];
            local_94 = local_94 + 1;
          }
        }
        local_a8 = pcVar2;
      }
    }
  }
  local_10c = local_1c * local_20;
  local_110 = local_30 * local_34;
  local_114 = local_30 * local_34;
  local_118 = local_1c * local_20 * local_2c;
  Mat::Mat(in_stack_fffffffffffff720,(int)((ulong)in_stack_fffffffffffff718 >> 0x20),
           (int)in_stack_fffffffffffff718,(int)((ulong)in_stack_fffffffffffff710 >> 0x20),
           CONCAT17(in_stack_fffffffffffff70f,in_stack_fffffffffffff708),(Allocator *)0x13e0ea);
  local_15c = local_110 >> 2;
  local_160 = local_15c << 2;
  for (local_164 = 0; local_164 < local_15c; local_164 = local_164 + 1) {
    local_168 = local_164 << 2;
    local_170 = Mat::row<signed_char>(&local_88,local_168);
    local_178 = Mat::row<signed_char>(&local_88,local_168 + 1);
    local_180 = Mat::row<signed_char>(&local_88,local_168 + 2);
    local_188 = Mat::row<signed_char>(&local_88,local_168 + 3);
    Mat::channel(in_stack_fffffffffffff718,(int)((ulong)in_stack_fffffffffffff710 >> 0x20));
    pcVar2 = Mat::operator_cast_to_signed_char_(&local_1d0);
    Mat::~Mat((Mat *)0x13e20b);
    local_190 = pcVar2;
    for (local_1d4 = 0; local_1d4 + 1 < local_2c * local_10c; local_1d4 = local_1d4 + 2) {
      *local_190 = *local_170;
      local_190[1] = local_170[1];
      local_190[2] = *local_178;
      local_190[3] = local_178[1];
      local_190[4] = *local_180;
      local_190[5] = local_180[1];
      local_190[6] = *local_188;
      local_190[7] = local_188[1];
      local_190 = local_190 + 8;
      local_170 = local_170 + 2;
      local_178 = local_178 + 2;
      local_180 = local_180 + 2;
      local_188 = local_188 + 2;
    }
    for (; local_1d4 < local_2c * local_10c; local_1d4 = local_1d4 + 1) {
      *local_190 = *local_170;
      local_190[1] = *local_178;
      local_190[2] = *local_180;
      local_190[3] = *local_188;
      local_190 = local_190 + 4;
      local_170 = local_170 + 1;
      local_178 = local_178 + 1;
      local_180 = local_180 + 1;
      local_188 = local_188 + 1;
    }
  }
  for (local_1d8 = local_160; local_1d8 < local_110; local_1d8 = local_1d8 + 1) {
    local_1e0 = Mat::row<signed_char>(&local_88,local_1d8);
    Mat::channel(in_stack_fffffffffffff718,(int)((ulong)in_stack_fffffffffffff710 >> 0x20));
    pcVar2 = Mat::operator_cast_to_signed_char_(&local_228);
    Mat::~Mat((Mat *)0x13e520);
    local_1e8 = pcVar2;
    for (local_22c = 0; local_22c + 1 < local_2c * local_10c; local_22c = local_22c + 2) {
      *local_1e8 = *local_1e0;
      local_1e8[1] = local_1e0[1];
      local_1e8 = local_1e8 + 2;
      local_1e0 = local_1e0 + 2;
    }
    for (; local_22c < local_2c * local_10c; local_22c = local_22c + 1) {
      *local_1e8 = *local_1e0;
      local_1e8 = local_1e8 + 1;
      local_1e0 = local_1e0 + 1;
    }
  }
  Mat::Mat(in_stack_fffffffffffff720,(int)((ulong)in_stack_fffffffffffff718 >> 0x20),
           (int)in_stack_fffffffffffff718,(int)((ulong)in_stack_fffffffffffff710 >> 0x20),
           CONCAT17(in_stack_fffffffffffff70f,in_stack_fffffffffffff708),(Allocator *)0x13e692);
  local_274 = local_38 >> 2;
  local_278 = local_274 << 2;
  for (local_27c = 0; local_27c < local_274; local_27c = local_27c + 1) {
    local_280 = local_27c * 4;
    local_288 = local_40 + local_280 * local_2c * local_10c;
    local_290 = local_40 + (local_280 + 1) * local_2c * local_10c;
    local_298 = local_40 + (local_280 + 2) * local_2c * local_10c;
    local_2a0 = local_40 + (local_280 + 3) * local_2c * local_10c;
    Mat::channel(in_stack_fffffffffffff718,(int)((ulong)in_stack_fffffffffffff710 >> 0x20));
    pcVar2 = Mat::operator_cast_to_signed_char_(&local_2e8);
    Mat::~Mat((Mat *)0x13e815);
    local_2a8 = pcVar2;
    for (local_2ec = 0; local_2ec + 1 < local_2c * local_10c; local_2ec = local_2ec + 2) {
      *local_2a8 = *local_288;
      local_2a8[1] = local_288[1];
      local_2a8[2] = *local_290;
      local_2a8[3] = local_290[1];
      local_2a8[4] = *local_298;
      local_2a8[5] = local_298[1];
      local_2a8[6] = *local_2a0;
      local_2a8[7] = local_2a0[1];
      local_2a8 = local_2a8 + 8;
      local_288 = local_288 + 2;
      local_290 = local_290 + 2;
      local_298 = local_298 + 2;
      local_2a0 = local_2a0 + 2;
    }
    for (; local_2ec < local_2c * local_10c; local_2ec = local_2ec + 1) {
      *local_2a8 = *local_288;
      local_2a8[1] = *local_290;
      local_2a8[2] = *local_298;
      local_2a8[3] = *local_2a0;
      local_2a8 = local_2a8 + 4;
      local_288 = local_288 + 1;
      local_290 = local_290 + 1;
      local_298 = local_298 + 1;
      local_2a0 = local_2a0 + 1;
    }
  }
  for (local_2f0 = local_278; local_2f0 < local_38; local_2f0 = local_2f0 + 1) {
    local_2f8 = local_40 + local_2f0 * local_2c * local_10c;
    Mat::channel(in_stack_fffffffffffff718,(int)((ulong)in_stack_fffffffffffff710 >> 0x20));
    pcVar2 = Mat::operator_cast_to_signed_char_(&local_340);
    Mat::~Mat((Mat *)0x13eb4c);
    local_300 = pcVar2;
    for (local_344 = 0; local_344 + 1 < local_2c * local_10c; local_344 = local_344 + 2) {
      *local_300 = *local_2f8;
      local_300[1] = local_2f8[1];
      local_300 = local_300 + 2;
      local_2f8 = local_2f8 + 2;
    }
    for (; local_344 < local_2c * local_10c; local_344 = local_344 + 1) {
      *local_300 = *local_2f8;
      local_300 = local_300 + 1;
      local_2f8 = local_2f8 + 1;
    }
  }
  local_348 = local_38 >> 2;
  local_34c = local_348 << 2;
  for (local_350 = 0; local_350 < local_348; local_350 = local_350 + 1) {
    local_354 = local_350 << 2;
    Mat::channel(in_stack_fffffffffffff718,(int)((ulong)in_stack_fffffffffffff710 >> 0x20));
    pcVar2 = Mat::operator_cast_to_signed_char_(&local_3a0);
    Mat::~Mat((Mat *)0x13ed1f);
    local_360 = pcVar2;
    Mat::channel(in_stack_fffffffffffff718,(int)((ulong)in_stack_fffffffffffff710 >> 0x20));
    pcVar2 = Mat::operator_cast_to_signed_char_(&local_3e8);
    Mat::~Mat((Mat *)0x13ed79);
    local_3a8 = pcVar2;
    Mat::channel(in_stack_fffffffffffff718,(int)((ulong)in_stack_fffffffffffff710 >> 0x20));
    pcVar2 = Mat::operator_cast_to_signed_char_(&local_430);
    Mat::~Mat((Mat *)0x13edd4);
    local_3f0 = pcVar2;
    Mat::channel(in_stack_fffffffffffff718,(int)((ulong)in_stack_fffffffffffff710 >> 0x20));
    pcVar2 = Mat::operator_cast_to_signed_char_(&local_478);
    Mat::~Mat((Mat *)0x13ee27);
    if (local_48 == (float *)0x0) {
      local_85c = 0.0;
    }
    else {
      local_85c = local_48[local_354];
    }
    local_47c = local_85c;
    if (local_48 == (float *)0x0) {
      local_860 = 0.0;
    }
    else {
      local_860 = local_48[local_354 + 1];
    }
    local_480 = local_860;
    if (local_48 == (float *)0x0) {
      local_864 = 0.0;
    }
    else {
      local_864 = local_48[local_354 + 2];
    }
    local_484 = local_864;
    if (local_48 == (float *)0x0) {
      local_868 = 0.0;
    }
    else {
      local_868 = local_48[local_354 + 3];
    }
    local_488 = local_868;
    local_438 = pcVar2;
    pvVar3 = std::vector<float,_std::allocator<float>_>::operator[]
                       (in_stack_00000018,(long)(local_354 << 1));
    local_48c = *pvVar3;
    pvVar3 = std::vector<float,_std::allocator<float>_>::operator[]
                       (in_stack_00000018,(long)(local_354 * 2 + 1));
    local_490 = *pvVar3;
    pvVar3 = std::vector<float,_std::allocator<float>_>::operator[]
                       (in_stack_00000018,(long)((local_354 + 1) * 2));
    local_494 = *pvVar3;
    pvVar3 = std::vector<float,_std::allocator<float>_>::operator[]
                       (in_stack_00000018,(long)((local_354 + 1) * 2 + 1));
    local_498 = *pvVar3;
    pvVar3 = std::vector<float,_std::allocator<float>_>::operator[]
                       (in_stack_00000018,(long)((local_354 + 2) * 2));
    local_49c = *pvVar3;
    pvVar3 = std::vector<float,_std::allocator<float>_>::operator[]
                       (in_stack_00000018,(long)((local_354 + 2) * 2 + 1));
    local_4a0 = *pvVar3;
    pvVar3 = std::vector<float,_std::allocator<float>_>::operator[]
                       (in_stack_00000018,(long)((local_354 + 3) * 2));
    local_4a4 = *pvVar3;
    pvVar3 = std::vector<float,_std::allocator<float>_>::operator[]
                       (in_stack_00000018,(long)((local_354 + 3) * 2 + 1));
    local_4a8 = *pvVar3;
    for (local_4ac = 0; local_4ac + 3 < local_114; local_4ac = local_4ac + 4) {
      Mat::channel(in_stack_fffffffffffff718,(int)((ulong)in_stack_fffffffffffff710 >> 0x20));
      pcVar2 = Mat::operator_cast_to_signed_char_(&local_4f8);
      Mat::~Mat((Mat *)0x13f137);
      local_4b8 = pcVar2;
      Mat::channel(in_stack_fffffffffffff718,(int)((ulong)in_stack_fffffffffffff710 >> 0x20));
      pcVar2 = Mat::operator_cast_to_signed_char_(&local_540);
      Mat::~Mat((Mat *)0x13f191);
      local_500 = pcVar2;
      memset(local_558,0,0x10);
      memset(local_568,0,0x10);
      memset(local_578,0,0x10);
      memset(local_588,0,0x10);
      for (local_58c = 0; local_58c + 1 < local_118; local_58c = local_58c + 2) {
        for (local_590 = 0; local_590 < 4; local_590 = local_590 + 1) {
          local_558[local_590] =
               (int)*local_500 * (int)local_4b8[local_590 << 1] + local_558[local_590];
          local_558[local_590] =
               (int)local_500[1] * (int)local_4b8[local_590 * 2 + 1] + local_558[local_590];
          local_568[local_590] =
               (int)local_500[2] * (int)local_4b8[local_590 << 1] + local_568[local_590];
          local_568[local_590] =
               (int)local_500[3] * (int)local_4b8[local_590 * 2 + 1] + local_568[local_590];
          local_578[local_590] =
               (int)local_500[4] * (int)local_4b8[local_590 << 1] + local_578[local_590];
          local_578[local_590] =
               (int)local_500[5] * (int)local_4b8[local_590 * 2 + 1] + local_578[local_590];
          local_588[local_590] =
               (int)local_500[6] * (int)local_4b8[local_590 << 1] + local_588[local_590];
          local_588[local_590] =
               (int)local_500[7] * (int)local_4b8[local_590 * 2 + 1] + local_588[local_590];
        }
        local_500 = local_500 + 8;
        local_4b8 = local_4b8 + 8;
      }
      for (; local_58c < local_118; local_58c = local_58c + 1) {
        for (local_594 = 0; local_594 < 4; local_594 = local_594 + 1) {
          local_558[local_594] = (int)*local_500 * (int)local_4b8[local_594] + local_558[local_594];
          local_568[local_594] =
               (int)local_500[1] * (int)local_4b8[local_594] + local_568[local_594];
          local_578[local_594] =
               (int)local_500[2] * (int)local_4b8[local_594] + local_578[local_594];
          local_588[local_594] =
               (int)local_500[3] * (int)local_4b8[local_594] + local_588[local_594];
        }
        local_500 = local_500 + 4;
        local_4b8 = local_4b8 + 4;
      }
      for (local_598 = 0; local_598 < 4; local_598 = local_598 + 1) {
        cVar1 = float2int8(SUB84(in_stack_fffffffffffff710,0));
        local_360[local_598] = cVar1;
        cVar1 = float2int8(SUB84(in_stack_fffffffffffff710,0));
        local_3a8[local_598] = cVar1;
        cVar1 = float2int8(SUB84(in_stack_fffffffffffff710,0));
        local_3f0[local_598] = cVar1;
        cVar1 = float2int8(SUB84(in_stack_fffffffffffff710,0));
        local_438[local_598] = cVar1;
      }
      local_360 = local_360 + 4;
      local_3a8 = local_3a8 + 4;
      local_3f0 = local_3f0 + 4;
      local_438 = local_438 + 4;
    }
    for (; local_4ac < local_114; local_4ac = local_4ac + 1) {
      local_59c = 0;
      local_5a0 = 0;
      local_5a4 = 0;
      local_5a8 = 0;
      Mat::channel(in_stack_fffffffffffff718,(int)((ulong)in_stack_fffffffffffff710 >> 0x20));
      pcVar2 = Mat::operator_cast_to_signed_char_(&local_5f0);
      Mat::~Mat((Mat *)0x13f86c);
      local_5b0 = pcVar2;
      Mat::channel(in_stack_fffffffffffff718,(int)((ulong)in_stack_fffffffffffff710 >> 0x20));
      pcVar2 = Mat::operator_cast_to_signed_char_(&local_638);
      Mat::~Mat((Mat *)0x13f8c3);
      local_5f8 = pcVar2;
      for (local_63c = 0; local_63c + 1 < local_118; local_63c = local_63c + 2) {
        local_59c = (int)local_5f8[1] * (int)local_5b0[1] +
                    (int)*local_5f8 * (int)*local_5b0 + local_59c;
        local_5a0 = (int)local_5f8[3] * (int)local_5b0[1] +
                    (int)local_5f8[2] * (int)*local_5b0 + local_5a0;
        local_5a4 = (int)local_5f8[5] * (int)local_5b0[1] +
                    (int)local_5f8[4] * (int)*local_5b0 + local_5a4;
        local_5a8 = (int)local_5f8[7] * (int)local_5b0[1] +
                    (int)local_5f8[6] * (int)*local_5b0 + local_5a8;
        local_5f8 = local_5f8 + 8;
        local_5b0 = local_5b0 + 2;
      }
      for (; local_63c < local_118; local_63c = local_63c + 1) {
        local_59c = (int)*local_5f8 * (int)*local_5b0 + local_59c;
        local_5a0 = (int)local_5f8[1] * (int)*local_5b0 + local_5a0;
        local_5a4 = (int)local_5f8[2] * (int)*local_5b0 + local_5a4;
        local_5a8 = (int)local_5f8[3] * (int)*local_5b0 + local_5a8;
        local_5f8 = local_5f8 + 4;
        local_5b0 = local_5b0 + 1;
      }
      cVar1 = float2int8(SUB84(in_stack_fffffffffffff710,0));
      *local_360 = cVar1;
      cVar1 = float2int8(SUB84(in_stack_fffffffffffff710,0));
      *local_3a8 = cVar1;
      cVar1 = float2int8(SUB84(in_stack_fffffffffffff710,0));
      *local_3f0 = cVar1;
      cVar1 = float2int8(SUB84(in_stack_fffffffffffff710,0));
      *local_438 = cVar1;
      local_360 = local_360 + 1;
      local_3a8 = local_3a8 + 1;
      local_3f0 = local_3f0 + 1;
      local_438 = local_438 + 1;
    }
  }
  for (local_640 = local_34c; local_640 < local_38; local_640 = local_640 + 1) {
    Mat::channel(in_stack_fffffffffffff718,(int)((ulong)in_stack_fffffffffffff710 >> 0x20));
    pcVar2 = Mat::operator_cast_to_signed_char_(&local_688);
    Mat::~Mat((Mat *)0x13fd67);
    if (local_48 == (float *)0x0) {
      local_8b4 = 0.0;
    }
    else {
      local_8b4 = local_48[local_640];
    }
    local_68c = local_8b4;
    local_648 = pcVar2;
    pvVar3 = std::vector<float,_std::allocator<float>_>::operator[]
                       (in_stack_00000018,(long)(local_640 << 1));
    local_690 = *pvVar3;
    pvVar3 = std::vector<float,_std::allocator<float>_>::operator[]
                       (in_stack_00000018,(long)(local_640 * 2 + 1));
    local_694 = *pvVar3;
    for (local_698 = 0; local_698 + 3 < local_114; local_698 = local_698 + 4) {
      Mat::channel(in_stack_fffffffffffff718,(int)((ulong)in_stack_fffffffffffff710 >> 0x20));
      pcVar2 = Mat::operator_cast_to_signed_char_(&local_6e0);
      Mat::~Mat((Mat *)0x13fe73);
      local_6a0 = pcVar2;
      Mat::channel(in_stack_fffffffffffff718,(int)((ulong)in_stack_fffffffffffff710 >> 0x20));
      pcVar2 = Mat::operator_cast_to_signed_char_(&local_728);
      Mat::~Mat((Mat *)0x13fed5);
      local_6e8 = pcVar2;
      memset(local_738,0,0x10);
      for (local_73c = 0; local_73c + 1 < local_118; local_73c = local_73c + 2) {
        for (local_740 = 0; local_740 < 4; local_740 = local_740 + 1) {
          local_738[local_740] =
               (int)*local_6e8 * (int)local_6a0[local_740 << 1] + local_738[local_740];
          local_738[local_740] =
               (int)local_6e8[1] * (int)local_6a0[local_740 * 2 + 1] + local_738[local_740];
        }
        local_6e8 = local_6e8 + 2;
        local_6a0 = local_6a0 + 8;
      }
      for (; local_73c < local_118; local_73c = local_73c + 1) {
        for (local_744 = 0; local_744 < 4; local_744 = local_744 + 1) {
          local_738[local_744] = (int)*local_6e8 * (int)local_6a0[local_744] + local_738[local_744];
        }
        local_6e8 = local_6e8 + 1;
        local_6a0 = local_6a0 + 4;
      }
      for (local_748 = 0; local_748 < 4; local_748 = local_748 + 1) {
        cVar1 = float2int8(SUB84(in_stack_fffffffffffff710,0));
        local_648[local_748] = cVar1;
      }
      local_648 = local_648 + 4;
    }
    for (; local_698 < local_114; local_698 = local_698 + 1) {
      local_74c = 0;
      Mat::channel(in_stack_fffffffffffff718,(int)((ulong)in_stack_fffffffffffff710 >> 0x20));
      _c = (int)((ulong)in_stack_fffffffffffff710 >> 0x20);
      in_stack_fffffffffffff718 = &local_798;
      pcVar2 = Mat::operator_cast_to_signed_char_(in_stack_fffffffffffff718);
      Mat::~Mat((Mat *)0x1401d9);
      local_758 = pcVar2;
      Mat::channel(in_stack_fffffffffffff718,_c);
      in_stack_fffffffffffff710 = Mat::operator_cast_to_signed_char_(&local_7e0);
      Mat::~Mat((Mat *)0x14023b);
      local_7a0 = in_stack_fffffffffffff710;
      for (local_7e4 = 0; local_7e4 < local_118; local_7e4 = local_7e4 + 1) {
        local_74c = (int)*local_7a0 * (int)*local_758 + local_74c;
        local_7a0 = local_7a0 + 1;
        local_758 = local_758 + 1;
      }
      cVar1 = float2int8(SUB84(in_stack_fffffffffffff710,0));
      *local_648 = cVar1;
      local_648 = local_648 + 1;
    }
  }
  Mat::~Mat((Mat *)0x14035d);
  Mat::~Mat((Mat *)0x14036a);
  Mat::~Mat((Mat *)0x140377);
  return;
}

Assistant:

static void conv_im2col_sgemm_int8_requant_sse(const Mat &bottom_blob, Mat &top_blob, const Mat &_kernel, \
            const int kernel_w, const int kernel_h, const int stride_w, const int stride_h, const Mat &_bias, std::vector<float> scale_requant, const Option& opt)
{
    int w = bottom_blob.w;
    int inch = bottom_blob.c;

    int outw = top_blob.w;
    int outh = top_blob.h;
    int outch = top_blob.c;

    const signed char *kernel = _kernel;
    const float* bias = _bias;

    // im2row
    Mat bottom_im2row(kernel_h*kernel_w*inch, outw*outh, 1UL, opt.workspace_allocator);
    {
        signed char* ret = (signed char*)bottom_im2row;
        int retID = 0;
    
        for (int i=0; i<outh; i++)
        {
            for (int j=0; j<outw; j++)
            {
                for (int p=0; p<inch; p++)
                {
                    const signed char* input = bottom_blob.channel(p);
                    for (int u=0; u<kernel_h; u++)
                    {
                        for (int v=0; v<kernel_w; v++)
                        {    
                            int row = u + i * stride_h;
                            int col = v + j * stride_w;
                            int index = row * w + col;
                            ret[retID] = input[index];
                            retID++;
                        }
                    }                
                }
            }
        }
    }    

    int kernel_size = kernel_w * kernel_h;
    int out_size = outw * outh;

    // int M = outch;  // outch
    int N = outw * outh; // outsize or out stride
    int K = kernel_w * kernel_h * inch; // ksize * inch

    // bottom_im2row memory packed 4 x 4
    Mat bottom_tm(4*kernel_size, inch, out_size/4 + out_size%4, (size_t)1u, opt.workspace_allocator);
    {
        int nn_size = out_size >> 2;
        int remain_size_start = nn_size << 2;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int ii=0; ii<nn_size; ii++)
        {
            int i = ii * 4;

            const signed char* img0 = bottom_im2row.row<signed char>(i);
            const signed char* img1 = bottom_im2row.row<signed char>(i+1);
            const signed char* img2 = bottom_im2row.row<signed char>(i+2);
            const signed char* img3 = bottom_im2row.row<signed char>(i+3);

            signed char* tmpptr = bottom_tm.channel(i/4);

            int q = 0;
            for (; q+1<inch*kernel_size; q=q+2)
            {
                tmpptr[0] = img0[0];
                tmpptr[1] = img0[1];
                tmpptr[2] = img1[0];
                tmpptr[3] = img1[1];
                tmpptr[4] = img2[0];
                tmpptr[5] = img2[1];
                tmpptr[6] = img3[0];
                tmpptr[7] = img3[1];

                tmpptr += 8;
                img0 += 2;
                img1 += 2;
                img2 += 2;
                img3 += 2;
            }

            for (; q<inch*kernel_size; q++)
            {
                tmpptr[0] = img0[0];
                tmpptr[1] = img1[0];
                tmpptr[2] = img2[0];
                tmpptr[3] = img3[0];

                tmpptr += 4;
                img0 += 1;
                img1 += 1;
                img2 += 1;
                img3 += 1;                
            }
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i=remain_size_start; i<out_size; i++)
        {
            const signed char* img0 = bottom_im2row.row<signed char>(i);

            signed char* tmpptr = bottom_tm.channel(i/4 + i%4);

            int q=0;
            for (; q+1<inch*kernel_size; q=q+2)
            {
                tmpptr[0] = img0[0];
                tmpptr[1] = img0[1];

                tmpptr += 2;
                img0 += 2;
            }

            for (; q<inch*kernel_size; q++)
            {
                tmpptr[0] = img0[0];

                tmpptr += 1;
                img0 += 1;
            }
        }       
    }

    // kernel memory packed 4 x 4
    Mat kernel_tm(4*kernel_size, inch, outch/4 + outch%4, (size_t)1u, opt.workspace_allocator);
    {
        int nn_outch = 0;
        int remain_outch_start = 0;

        nn_outch = outch >> 2;
        remain_outch_start = nn_outch << 2;
        
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int pp=0; pp<nn_outch; pp++)
        {
            int p = pp * 4;

            const signed char* k0 = kernel + (p+0)*inch*kernel_size;
            const signed char* k1 = kernel + (p+1)*inch*kernel_size;
            const signed char* k2 = kernel + (p+2)*inch*kernel_size;
            const signed char* k3 = kernel + (p+3)*inch*kernel_size;

            signed char* ktmp = kernel_tm.channel(p/4);

            int q=0;
            for (; q+1<inch*kernel_size; q+=2)
            {
                ktmp[0] = k0[0];
                ktmp[1] = k0[1];
                ktmp[2] = k1[0];
                ktmp[3] = k1[1];
                ktmp[4] = k2[0];
                ktmp[5] = k2[1];
                ktmp[6] = k3[0];
                ktmp[7] = k3[1];

                ktmp += 8;

                k0 += 2;
                k1 += 2;
                k2 += 2;
                k3 += 2;
            }

            for (; q<inch*kernel_size; q++)
            { 
                ktmp[0] = k0[0];
                ktmp[1] = k1[0];
                ktmp[2] = k2[0];
                ktmp[3] = k3[0];
                ktmp += 4;

                k0 += 1;
                k1 += 1;
                k2 += 1;
                k3 += 1;
            }           
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int p=remain_outch_start; p<outch; p++)
        {
            const signed char* k0 = kernel + (p+0)*inch*kernel_size;

            signed char* ktmp = kernel_tm.channel(p/4 + p%4);

            int q=0;
            for (; q+1<inch*kernel_size; q=q+2)
            {
                ktmp[0] = k0[0];
                ktmp[1] = k0[1];
                ktmp += 2;
                k0 += 2;
            }

            for (; q<inch*kernel_size; q++)
            {
                ktmp[0] = k0[0];
                ktmp++;
                k0++;
            }
        }
    }    

    // 4x4
    // sgemm(int M, int N, int K, float* A, float* B, float* C)
    {
        // int M = outch;  // outch
        // int N = outw * outh; // outsize or out stride
        // int L = kernel_w * kernel_h * inch; // ksize * inch

        int nn_outch = 0;
        int remain_outch_start = 0;

        nn_outch = outch >> 2;
        remain_outch_start = nn_outch << 2;
        
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int pp=0; pp<nn_outch; pp++)
        {
            int i = pp * 4;

            signed char* output0 = top_blob.channel(i);
            signed char* output1 = top_blob.channel(i+1);
            signed char* output2 = top_blob.channel(i+2);
            signed char* output3 = top_blob.channel(i+3);

            const float bias0 = bias ? bias[i] : 0.f;
            const float bias1 = bias ? bias[i+1] : 0.f;
            const float bias2 = bias ? bias[i+2] : 0.f;
            const float bias3 = bias ? bias[i+3] : 0.f;

            const float scale_requant_in0  = scale_requant[2*i];
            const float scale_requant_out0 = scale_requant[2*i+1];
            const float scale_requant_in1  = scale_requant[2*(i+1)];
            const float scale_requant_out1 = scale_requant[2*(i+1)+1];
            const float scale_requant_in2  = scale_requant[2*(i+2)];
            const float scale_requant_out2 = scale_requant[2*(i+2)+1];
            const float scale_requant_in3  = scale_requant[2*(i+3)];
            const float scale_requant_out3 = scale_requant[2*(i+3)+1];

            int j=0;
            for (; j+3<N; j=j+4)
            {
                signed char* vb = bottom_tm.channel(j/4);
                signed char* va = kernel_tm.channel(i/4);
                
                int sum0[4] = {0};
                int sum1[4] = {0};
                int sum2[4] = {0};
                int sum3[4] = {0};
               
                int k=0;

                for (; k+1<K; k=k+2)
                {
                    for (int n=0; n<4; n++)
                    {
                        sum0[n] += (int)va[0] * vb[2*n];   // k0
                        sum0[n] += (int)va[1] * vb[2*n+1];

                        sum1[n] += (int)va[2] * vb[2*n];   // k1
                        sum1[n] += (int)va[3] * vb[2*n+1];

                        sum2[n] += (int)va[4] * vb[2*n];   // k2
                        sum2[n] += (int)va[5] * vb[2*n+1];

                        sum3[n] += (int)va[6] * vb[2*n];   // k3
                        sum3[n] += (int)va[7] * vb[2*n+1];
                    }

                    va += 8;
                    vb += 8;
                }

                for (; k<K; k++)
                {
                    for (int n=0; n<4; n++)
                    {
                        sum0[n] += (int)va[0] * vb[n];
                        sum1[n] += (int)va[1] * vb[n];
                        sum2[n] += (int)va[2] * vb[n];
                        sum3[n] += (int)va[3] * vb[n];
                    }
                    
                    va += 4;
                    vb += 4;
                }

                for (int n=0; n<4; n++)
                {
                    output0[n] = float2int8(((float)sum0[n] * scale_requant_in0 + bias0) * scale_requant_out0);
                    output1[n] = float2int8(((float)sum1[n] * scale_requant_in1 + bias1) * scale_requant_out1);
                    output2[n] = float2int8(((float)sum2[n] * scale_requant_in2 + bias2) * scale_requant_out2);
                    output3[n] = float2int8(((float)sum3[n] * scale_requant_in3 + bias3) * scale_requant_out3);
                }
                output0 += 4;
                output1 += 4;
                output2 += 4;
                output3 += 4;
            }

            for (; j<N; j++)
            {                
                int sum0 = 0;
                int sum1 = 0;
                int sum2 = 0;
                int sum3 = 0;

                signed char* vb = bottom_tm.channel(j/4 + j%4);
                signed char* va = kernel_tm.channel(i/4);

                int k=0;

                for (; k+1<K; k=k+2)
                {
                    sum0 += (int)va[0] * vb[0];
                    sum0 += (int)va[1] * vb[1];

                    sum1 += (int)va[2] * vb[0];
                    sum1 += (int)va[3] * vb[1];

                    sum2 += (int)va[4] * vb[0];
                    sum2 += (int)va[5] * vb[1];

                    sum3 += (int)va[6] * vb[0];
                    sum3 += (int)va[7] * vb[1];

                    va += 8;
                    vb += 2;
                }

                for (; k<K; k++)
                {
                    sum0 += (int)va[0] * vb[0];
                    sum1 += (int)va[1] * vb[0];
                    sum2 += (int)va[2] * vb[0];
                    sum3 += (int)va[3] * vb[0];

                    va += 4;
                    vb += 1;
                }
                
                output0[0] = float2int8(((float)sum0 * scale_requant_in0 + bias0) * scale_requant_out0);
                output1[0] = float2int8(((float)sum1 * scale_requant_in1 + bias1) * scale_requant_out1);
                output2[0] = float2int8(((float)sum2 * scale_requant_in2 + bias2) * scale_requant_out2);
                output3[0] = float2int8(((float)sum3 * scale_requant_in3 + bias3) * scale_requant_out3);

                output0++;
                output1++;
                output2++;
                output3++;
            }
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i=remain_outch_start; i<outch; i++)
        {
            signed char* output = top_blob.channel(i);

            const float bias0 = bias ? bias[i] : 0.f;

            const float scale_requant_in0  = scale_requant[2*i];
            const float scale_requant_out0 = scale_requant[2*i+1];            

            int j=0;
            for (; j+3<N; j=j+4)
            {
                signed char* vb = bottom_tm.channel(j/4);
                signed char* va = kernel_tm.channel(i/4 + i%4);
                int sum[4] = {0};

                int k=0;
                for (; k+1<K; k=k+2)
                {
                    for (int n=0; n<4; n++)
                    {
                        sum[n] += (int)va[0] * vb[2*n];
                        sum[n] += (int)va[1] * vb[2*n+1];
                    }
                    va += 2;
                    vb += 8;
                }

                for (; k<K; k++)
                {
                    for (int n=0; n<4; n++)
                    {
                        sum[n] += (int)va[0] * vb[n];
                    }
                    va += 1;
                    vb += 4;
                }

                for (int n=0; n<4; n++)
                {
                    output[n] = float2int8(((float)sum[n] * scale_requant_in0 + bias0) * scale_requant_out0);
                }
                output += 4;
            }

            for (; j<N; j++)
            {
                int sum = 0;

                signed char* vb = bottom_tm.channel(j/4 + j%4);
                signed char* va = kernel_tm.channel(i/4 + i%4);

                for (int k=0; k<K; k++)
                {
                    sum += (int)va[0] * vb[0];

                    va += 1;
                    vb += 1;
                }
                output[0] = float2int8(((float)sum * scale_requant_in0 + bias0) * scale_requant_out0);

                output++;
            }
        }
    }

    // // sgemm(int M, int N, int K, float* A, float* B, float* C)
    // {
    //     for (int i=0; i<M; i++)
    //     {
    //         int* output = top_blob.channel(i);

    //         for (int j=0; j<N; j++)
    //         {
    //             int sum = 0;

    //             signed char* vb = (signed char*)bottom_im2row + K * j;
    //             const signed char* va = kernel + K * i;

    //             for (int k=0; k<K; k++)
    //             {
    //                 sum += (int)va[0] * vb[0];

    //                 va += 1;
    //                 vb += 1;
    //             }
    //             output[0] = sum;

    //             output++;
    //         }
    //     }
    // }
}